

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printAssignName(JSPrinter *this,Ref node)

{
  size_t sVar1;
  AssignName *pAVar2;
  
  pAVar2 = cashew::Value::asAssignName(node.inst);
  emit(this,(pAVar2->target_).str._M_str);
  space(this);
  maybeSpace(this,'=');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '=';
  space(this);
  printChild(this,(pAVar2->super_Value).field_1.ref.inst,node,1);
  return;
}

Assistant:

void printAssignName(Ref node) {
    auto* assign = node->asAssignName();
    emit(assign->target().str.data());
    space();
    emit('=');
    space();
    printChild(assign->value(), node, 1);
  }